

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.h
# Opt level: O0

void __thiscall
CGL::GLScene::Scene::Scene
          (Scene *this,
          vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *objects
          ,vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> *lights)

{
  long in_RDI;
  
  std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::vector
            ((vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_> *)
             0x17b2d3);
  std::vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>::vector
            ((vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> *)
             0x17b2e6);
  SelectionInfo::SelectionInfo((SelectionInfo *)0x17b2f9);
  std::vector<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>::operator=
            (&this->objects,objects);
  std::vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_>::operator=
            ((vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> *)this
             ,(vector<CGL::GLScene::SceneLight_*,_std::allocator<CGL::GLScene::SceneLight_*>_> *)
              objects);
  *(undefined4 *)(in_RDI + 0x48) = 0xffffffff;
  *(undefined4 *)(in_RDI + 0x4c) = 0xffffffff;
  return;
}

Assistant:

Scene(std::vector<SceneObject *> objects, std::vector<SceneLight *> lights) {
    this->objects = objects;
    this->lights = lights;
    this->selectionIdx = -1;
    this->hoverIdx = -1;
  }